

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_file_column_mapper.cpp
# Opt level: O3

ResultColumnMapping * __thiscall
duckdb::MultiFileColumnMapper::CreateColumnMapping
          (ResultColumnMapping *__return_storage_ptr__,MultiFileColumnMapper *this)

{
  MultiFileColumnMappingMode MVar1;
  type pBVar2;
  InternalException *this_00;
  NameMapper name_map;
  undefined1 local_68 [16];
  _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::MultiFileLocalColumnId>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::MultiFileLocalColumnId>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
  local_58;
  
  pBVar2 = shared_ptr<duckdb::BaseFileReader,_true>::operator*(&this->reader_data->reader);
  MVar1 = this->bind_data->mapping;
  if (MVar1 == BY_FIELD_ID) {
    FieldIdMapper::FieldIdMapper((FieldIdMapper *)local_68,&pBVar2->columns);
    CreateColumnMappingByMapper(__return_storage_ptr__,this,(ColumnMapper *)local_68);
    local_68._0_8_ = &PTR__FieldIdMapper_0244ccd0;
    ::std::
    _Hashtable<int,_std::pair<const_int,_duckdb::MultiFileLocalColumnId>,_std::allocator<std::pair<const_int,_duckdb::MultiFileLocalColumnId>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
    ::~_Hashtable((_Hashtable<int,_std::pair<const_int,_duckdb::MultiFileLocalColumnId>,_std::allocator<std::pair<const_int,_duckdb::MultiFileLocalColumnId>_>,_std::__detail::_Select1st,_std::equal_to<int>,_std::hash<int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                   *)(local_68 + 8));
  }
  else {
    if (MVar1 != BY_NAME) {
      this_00 = (InternalException *)__cxa_allocate_exception(0x10);
      local_68._0_8_ = &local_58;
      ::std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_68,"Unsupported MultiFileColumnMappingMode type","");
      InternalException::InternalException(this_00,(string *)local_68);
      __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
    }
    NameMapper::NameMapper((NameMapper *)local_68,this,&pBVar2->columns);
    CreateColumnMappingByMapper(__return_storage_ptr__,this,(ColumnMapper *)local_68);
    local_68._0_8_ = &PTR__NameMapper_0244cc68;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::MultiFileLocalColumnId>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::MultiFileLocalColumnId>_>,_std::__detail::_Select1st,_duckdb::CaseInsensitiveStringEquality,_duckdb::CaseInsensitiveStringHashFunction,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
    ::~_Hashtable(&local_58);
  }
  return __return_storage_ptr__;
}

Assistant:

ResultColumnMapping MultiFileColumnMapper::CreateColumnMapping() {
	auto &reader = *reader_data.reader;
	auto &local_columns = reader.GetColumns();
	switch (bind_data.mapping) {
	case MultiFileColumnMappingMode::BY_NAME: {
		// we have expected types: create a map of name -> (local) column id
		NameMapper name_map(*this, local_columns);
		return CreateColumnMappingByMapper(name_map);
	}
	case MultiFileColumnMappingMode::BY_FIELD_ID: {
#ifdef DEBUG
		//! Make sure the global columns have field_ids to match on
		for (auto &column : global_columns) {
			D_ASSERT(!column.identifier.IsNull());
			D_ASSERT(column.identifier.type().id() == LogicalTypeId::INTEGER);
		}
#endif

		// we have expected types: create a map of field_id -> column index
		FieldIdMapper field_id_map(local_columns);
		return CreateColumnMappingByMapper(field_id_map);
	}
	default: {
		throw InternalException("Unsupported MultiFileColumnMappingMode type");
	}
	}
}